

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double NEST::NESTcalc::GetDiffLong_Liquid
                 (double dfield,bool highFieldModel,double Kelvin,double Bar,double Density,int Z,
                 short StdDev)

{
  double dVar1;
  double dVar2;
  undefined1 local_60 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> BoyleModelDL;
  double output;
  short StdDev_local;
  int Z_local;
  double Density_local;
  double Bar_local;
  double Kelvin_local;
  bool highFieldModel_local;
  double dfield_local;
  
  if (Z == 0x12) {
    dfield_local = (dfield * -0.0014 + 6.98) * 0.63;
  }
  else {
    if (highFieldModel) {
      GetBoyleModelDL();
      BoyleModelDL.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)interpolateFunction((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                         *)local_60,dfield,true);
      if (((double)BoyleModelDL.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == 0.0) &&
         (!NAN((double)BoyleModelDL.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage))) {
        std::operator<<((ostream *)&std::cerr,
                        "Looks like your desired drift field may be either too low or too high to interpolate a DL Returning DL=0.\n"
                       );
      }
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 local_60);
    }
    else if (StdDev < 1) {
      if ((StdDev < 0) || (0 < StdDev)) {
        dVar1 = pow(dfield,-0.24855);
        dVar2 = exp(-dfield / 35.661);
        BoyleModelDL.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar1 * 66.35 + dVar2 * 36.85)
        ;
      }
      else {
        dVar1 = pow(dfield,-0.22221);
        dVar2 = exp(-dfield / 32.821);
        BoyleModelDL.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(dVar1 * 57.381 + dVar2 * 127.27);
      }
    }
    else {
      dVar1 = pow(dfield,-0.16558);
      dVar2 = exp(-dfield / 23.922);
      BoyleModelDL.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar1 * 60.0 + dVar2 * 462.0);
    }
    dfield_local = (double)BoyleModelDL.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return dfield_local;
}

Assistant:

double NESTcalc::GetDiffLong_Liquid(
    double dfield, bool highFieldModel, double Kelvin, double Bar, double Density, int Z,
    short int StdDev)  // for gas: look@ Diff_Long_Gas above
{
  double output;

  if (Z == 18) {
    output = 0.63*(-0.0014*dfield+6.98);
    return output;  
  }

  // Use the standard NEST parameterization DiffLong=m1*f^(-m2)+m3*exp(-f/m4)
  if (!highFieldModel) {  // temperature dependence possible: D_L up as T down?
    if (StdDev >= 1)
      output = 60. * pow(dfield, -0.16558) + 462. * exp(-dfield / 23.922);
    // high D_L model (Njoya 2020) 60+/-49, -0.16558+/-0.13347, 462+/-126, 23.922+/-4.8931 (touches the -1-sigma errors)
    else if (StdDev >= 0 && StdDev < 1)
      output = 57.381 * pow(dfield, -0.22221) + 127.27 * exp(-dfield / 32.821);
    // fit to Aprile & Doke rev & arXiv:1102.2865 (Peter: XENON10/100); plus, LUX Run03 (181V/cm) & 1911.11580. Agrees with arXiv:2303.13963 (Yanina Biondi)
    else
      output = 66.35 * pow(dfield, -0.24855) + 36.85 * exp(-dfield / 35.661);
    // low D_L model (LZ 2023, Dan Hunt) 66.35+/-6.29, -0.24855+/-0.016508, 36.85+/-2.37, 35.661+/-2.2038 (low drift fields, double digits)
  }
  // Use the Boyle model, which is drastically different at high (>5kV/cm)
  // fields. Note here that the Boyle model is only at one temperature. First
  // double in pair is field, second is DL
  else {
    const std::vector<std::pair<double, double> > BoyleModelDL =
        GetBoyleModelDL();
    output = interpolateFunction(BoyleModelDL, dfield, true);
    if (output == 0)
      cerr << "Looks like your desired drift field may be either too low or "
              "too high to interpolate a DL Returning DL=0.\n";
  }
  return output;
}